

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

opj_bool jp2_read_jp2h(opj_jp2_t *jp2,opj_cio_t *cio,opj_jp2_color_t *color)

{
  ushort uVar1;
  opj_common_ptr poVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  opj_jp2_comps_t *poVar8;
  opj_jp2_cmap_comp_t *poVar9;
  uint *puVar10;
  opj_jp2_pclr_t *poVar11;
  opj_jp2_cdef_info_t *poVar12;
  opj_jp2_cdef_t *poVar13;
  uchar *puVar14;
  uchar *puVar15;
  char *pcVar16;
  OPJ_UINT32 OVar17;
  unsigned_short uVar18;
  opj_common_ptr cinfo;
  OPJ_INT32 OVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  opj_jp2_box_t box;
  opj_jp2_box_t local_44;
  opj_common_ptr local_38;
  
  poVar2 = jp2->cinfo;
  jp2_read_boxhdr(poVar2,cio,&box);
  do {
    if (box.type == 0x6a703268) break;
    if (box.type == 0x6a703263) {
      pcVar16 = "Expected JP2H Marker\n";
      cinfo = poVar2;
      goto LAB_00125d32;
    }
    cio_skip(cio,box.length - 8);
    if (cio->end <= cio->bp) {
      return 0;
    }
    jp2_read_boxhdr(poVar2,cio,&box);
  } while (box.type != 0x6a703268);
  cinfo = jp2->cinfo;
  jp2_read_boxhdr(cinfo,cio,&local_44);
  if (local_44.type == 0x69686472) {
    uVar3 = cio_read(cio,4);
    jp2->h = uVar3;
    uVar3 = cio_read(cio,4);
    jp2->w = uVar3;
    uVar3 = cio_read(cio,2);
    jp2->numcomps = uVar3;
    poVar8 = (opj_jp2_comps_t *)malloc((ulong)uVar3 * 0xc);
    jp2->comps = poVar8;
    uVar3 = cio_read(cio,1);
    jp2->bpc = uVar3;
    uVar3 = cio_read(cio,1);
    jp2->C = uVar3;
    uVar3 = cio_read(cio,1);
    jp2->UnkC = uVar3;
    uVar3 = cio_read(cio,1);
    jp2->IPR = uVar3;
    iVar4 = cio_tell(cio);
    if (iVar4 - local_44.init_pos == local_44.length) {
      iVar4 = box.length + box.init_pos;
      local_38 = poVar2;
      if (jp2->bpc != 0xff) {
LAB_00125d70:
        jp2_read_boxhdr(local_38,cio,&box);
        do {
          iVar5 = cio_tell(cio);
          if (iVar4 <= iVar5) {
            cio_seek(cio,iVar4);
            return (uint)(color->jp2_has_colr == '\x01');
          }
          if (box.type == 0x63646566) {
            if (jp2->ignore_pclr_cmap_cdef != 0) goto LAB_00125f22;
            if (color->jp2_cdef == (opj_jp2_cdef_t *)0x0) {
              uVar3 = cio_read(cio,2);
              uVar6 = uVar3 & 0xffff;
              if (uVar6 != 0) {
                poVar12 = (opj_jp2_cdef_info_t *)malloc((ulong)(uVar6 * 6));
                poVar13 = (opj_jp2_cdef_t *)malloc(0x10);
                color->jp2_cdef = poVar13;
                poVar13->info = poVar12;
                poVar13->n = (unsigned_short)uVar3;
                for (lVar20 = 0; (ulong)uVar6 * 6 - lVar20 != 0; lVar20 = lVar20 + 6) {
                  uVar3 = cio_read(cio,2);
                  *(short *)((long)&poVar12->cn + lVar20) = (short)uVar3;
                  uVar3 = cio_read(cio,2);
                  *(short *)((long)&poVar12->typ + lVar20) = (short)uVar3;
                  uVar3 = cio_read(cio,2);
                  *(short *)((long)&poVar12->asoc + lVar20) = (short)uVar3;
                }
                goto LAB_00125f40;
              }
            }
            cio_seek(cio,box.init_pos + 8);
            cio_skip(cio,box.length - 8);
          }
          else {
            if (box.type == 0x636d6170) {
              if (((jp2->ignore_pclr_cmap_cdef == 0) &&
                  (poVar11 = color->jp2_pclr, poVar11 != (opj_jp2_pclr_t *)0x0)) &&
                 (poVar11->cmap == (opj_jp2_cmap_comp_t *)0x0)) {
                uVar1 = poVar11->nr_channels;
                poVar9 = (opj_jp2_cmap_comp_t *)malloc((ulong)uVar1 << 2);
                for (uVar21 = 0; uVar1 != uVar21; uVar21 = uVar21 + 1) {
                  uVar3 = cio_read(cio,2);
                  poVar9[uVar21].cmp = (unsigned_short)uVar3;
                  uVar3 = cio_read(cio,1);
                  poVar9[uVar21].mtyp = (uchar)uVar3;
                  uVar3 = cio_read(cio,1);
                  poVar9[uVar21].pcol = (uchar)uVar3;
                }
                color->jp2_pclr->cmap = poVar9;
                goto LAB_00125f40;
              }
LAB_00125f22:
              cio_seek(cio,box.init_pos + 8);
              OVar17 = box.length;
            }
            else {
              if (box.type == 0x70636c72) {
                if ((jp2->ignore_pclr_cmap_cdef == 0) && (color->jp2_pclr == (opj_jp2_pclr_t *)0x0))
                {
                  uVar3 = cio_read(cio,2);
                  uVar6 = cio_read(cio,1);
                  uVar21 = (ulong)(uVar6 & 0xffff);
                  puVar10 = (uint *)malloc((ulong)((uVar3 & 0xffff) * (uVar6 & 0xffff)) << 2);
                  puVar14 = (uchar *)malloc(uVar21);
                  puVar15 = (uchar *)malloc(uVar21);
                  poVar11 = (opj_jp2_pclr_t *)malloc(0x28);
                  poVar11->channel_sign = puVar15;
                  poVar11->channel_size = puVar14;
                  poVar11->entries = puVar10;
                  poVar11->nr_entries = (unsigned_short)uVar3;
                  poVar11->nr_channels = (unsigned_short)uVar6;
                  poVar11->cmap = (opj_jp2_cmap_comp_t *)0x0;
                  color->jp2_pclr = poVar11;
                  for (uVar22 = 0; uVar21 != uVar22; uVar22 = uVar22 + 1) {
                    uVar6 = cio_read(cio,1);
                    puVar14[uVar22] = ((byte)uVar6 & 0x7f) + 1;
                    puVar15[uVar22] = (byte)uVar6 >> 7;
                  }
                  for (uVar18 = 0; uVar18 != (unsigned_short)uVar3; uVar18 = uVar18 + 1) {
                    for (uVar22 = 0; uVar21 != uVar22; uVar22 = uVar22 + 1) {
                      uVar6 = cio_read(cio,(uint)(puVar14[uVar22] >> 3));
                      *puVar10 = uVar6;
                      puVar10 = puVar10 + 1;
                    }
                  }
                  goto LAB_00125f40;
                }
                goto LAB_00125f22;
              }
              if (box.type != 0x636f6c72) goto LAB_00125f22;
              OVar17 = box.length;
              OVar19 = box.init_pos;
              if (color->jp2_has_colr == '\0') {
                poVar2 = jp2->cinfo;
                uVar3 = cio_read(cio,1);
                jp2->meth = uVar3;
                uVar3 = cio_read(cio,1);
                jp2->precedence = uVar3;
                uVar3 = cio_read(cio,1);
                OVar19 = box.init_pos;
                OVar17 = box.length;
                jp2->approx = uVar3;
                if (jp2->meth == 2) {
                  iVar5 = box.length + box.init_pos;
                  iVar7 = cio_tell(cio);
                  uVar3 = iVar5 - iVar7;
                  if (-1 < (int)uVar3) {
                    if (uVar3 != 0) {
                      puVar14 = cio_getbp(cio);
                      puVar15 = (uchar *)malloc((ulong)uVar3);
                      color->icc_profile_buf = puVar15;
                      color->icc_profile_len = uVar3;
                      iVar7 = cio_tell(cio);
                      cio_skip(cio,iVar5 - iVar7);
                      memcpy(color->icc_profile_buf,puVar14,(ulong)uVar3);
                    }
                    goto LAB_00126115;
                  }
                  pcVar16 = "Error with COLR box size\n";
                }
                else {
                  if (jp2->meth == 1) {
                    uVar3 = cio_read(cio,4);
                    jp2->enumcs = uVar3;
                  }
LAB_00126115:
                  iVar5 = cio_tell(cio);
                  if (iVar5 - box.init_pos == box.length) {
                    color->jp2_has_colr = '\x01';
                    goto LAB_00125f40;
                  }
                  pcVar16 = "Error with COLR Box\n";
                  OVar17 = box.length;
                  OVar19 = box.init_pos;
                }
                opj_event_msg(poVar2,1,pcVar16);
              }
              cio_seek(cio,OVar19 + 8);
            }
            cio_skip(cio,OVar17 - 8);
          }
LAB_00125f40:
          jp2_read_boxhdr(local_38,cio,&box);
        } while( true );
      }
      cinfo = jp2->cinfo;
      jp2_read_boxhdr(cinfo,cio,&local_44);
      if (local_44.type == 0x62706363) {
        lVar20 = 8;
        for (uVar21 = 0; uVar21 < jp2->numcomps; uVar21 = uVar21 + 1) {
          uVar3 = cio_read(cio,1);
          *(uint *)((long)&jp2->comps->depth + lVar20) = uVar3;
          lVar20 = lVar20 + 0xc;
        }
        iVar5 = cio_tell(cio);
        if (iVar5 - local_44.init_pos == local_44.length) goto LAB_00125d70;
        pcVar16 = "Error with BPCC Box\n";
      }
      else {
        pcVar16 = "Expected BPCC Marker\n";
      }
    }
    else {
      pcVar16 = "Error with IHDR Box\n";
    }
  }
  else {
    pcVar16 = "Expected IHDR Marker\n";
  }
LAB_00125d32:
  opj_event_msg(cinfo,1,pcVar16);
  return 0;
}

Assistant:

opj_bool jp2_read_jp2h(opj_jp2_t *jp2, opj_cio_t *cio, opj_jp2_color_t *color) 
{
	opj_jp2_box_t box;
	int jp2h_end;

	opj_common_ptr cinfo = jp2->cinfo;

	jp2_read_boxhdr(cinfo, cio, &box);
	do 
   {
	if (JP2_JP2H != box.type) 
  {
	if (box.type == JP2_JP2C) 
 {
	opj_event_msg(cinfo, EVT_ERROR, "Expected JP2H Marker\n");
	return OPJ_FALSE;
 }
	cio_skip(cio, box.length - 8);

	if(cio->bp >= cio->end) return OPJ_FALSE;

	jp2_read_boxhdr(cinfo, cio, &box);
  }
   } while(JP2_JP2H != box.type);

	if (!jp2_read_ihdr(jp2, cio))
		return OPJ_FALSE;
	jp2h_end = box.init_pos + box.length;

	if (jp2->bpc == 255) 
   {
	if (!jp2_read_bpcc(jp2, cio))
		return OPJ_FALSE;
   }
	jp2_read_boxhdr(cinfo, cio, &box);

	while(cio_tell(cio) < jp2h_end)
   {
	if(box.type == JP2_COLR)
  {
	if( !jp2_read_colr(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
    if(box.type == JP2_CDEF && !jp2->ignore_pclr_cmap_cdef)
  {
    if( !jp2_read_cdef(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
    if(box.type == JP2_PCLR && !jp2->ignore_pclr_cmap_cdef)
  {
    if( !jp2_read_pclr(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
    if(box.type == JP2_CMAP && !jp2->ignore_pclr_cmap_cdef)
  {
    if( !jp2_read_cmap(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
	cio_seek(cio, box.init_pos + 8);
	cio_skip(cio, box.length - 8);
	jp2_read_boxhdr(cinfo, cio, &box);

   }/* while(cio_tell(cio) < box_end) */

	cio_seek(cio, jp2h_end);

/* Part 1, I.5.3.3 : 'must contain at least one' */
	return (color->jp2_has_colr == 1);

}